

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ref_node.c
# Opt level: O0

REF_STATUS ref_node_clip_bary3(REF_DBL *orig_bary,REF_DBL *bary)

{
  double dVar1;
  double local_90;
  double local_80;
  double local_78;
  double local_68;
  double local_60;
  double local_50;
  REF_DBL local_48;
  REF_DBL local_40;
  REF_DBL local_38;
  int local_30;
  int local_2c;
  REF_INT largest;
  REF_INT i;
  REF_DBL total;
  REF_DBL *bary_local;
  REF_DBL *orig_bary_local;
  
  if (0.0 < *orig_bary || *orig_bary == 0.0) {
    local_38 = *orig_bary;
  }
  else {
    local_38 = 0.0;
  }
  *bary = local_38;
  if (0.0 < orig_bary[1] || orig_bary[1] == 0.0) {
    local_40 = orig_bary[1];
  }
  else {
    local_40 = 0.0;
  }
  bary[1] = local_40;
  if (0.0 < orig_bary[2] || orig_bary[2] == 0.0) {
    local_48 = orig_bary[2];
  }
  else {
    local_48 = 0.0;
  }
  bary[2] = local_48;
  dVar1 = *bary + bary[1] + bary[2];
  if (dVar1 * 1e+20 <= 0.0) {
    local_50 = -(dVar1 * 1e+20);
  }
  else {
    local_50 = dVar1 * 1e+20;
  }
  if (*bary <= 0.0) {
    local_60 = -*bary;
  }
  else {
    local_60 = *bary;
  }
  if (local_60 < local_50) {
    if (dVar1 * 1e+20 <= 0.0) {
      local_68 = -(dVar1 * 1e+20);
    }
    else {
      local_68 = dVar1 * 1e+20;
    }
    if (bary[1] <= 0.0) {
      local_78 = -bary[1];
    }
    else {
      local_78 = bary[1];
    }
    if (local_78 < local_68) {
      if (dVar1 * 1e+20 <= 0.0) {
        local_80 = -(dVar1 * 1e+20);
      }
      else {
        local_80 = dVar1 * 1e+20;
      }
      if (bary[2] <= 0.0) {
        local_90 = -bary[2];
      }
      else {
        local_90 = bary[2];
      }
      if (local_90 < local_80) {
        *bary = *bary / dVar1;
        bary[1] = bary[1] / dVar1;
        bary[2] = bary[2] / dVar1;
        if (*bary < 0.0) {
          printf("%s: %d: %s: %s\n",
                 "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_node.c",
                 0xbd3,"ref_node_clip_bary3","bary[0] not positive");
          return 1;
        }
        if (bary[1] < 0.0) {
          printf("%s: %d: %s: %s\n",
                 "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_node.c",
                 0xbd4,"ref_node_clip_bary3","bary[1] not positive");
          return 1;
        }
        if (bary[2] < 0.0) {
          printf("%s: %d: %s: %s\n",
                 "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_node.c",
                 0xbd5,"ref_node_clip_bary3","bary[2] not positive");
          return 1;
        }
        return 0;
      }
    }
  }
  printf("%s: %d: %s: div zero\ntot %.18e\nbary %.18e %.18e %.18e\n",dVar1,*orig_bary,orig_bary[1],
         orig_bary[2],
         "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_node.c",0xbc6,
         "ref_node_clip_bary3");
  printf("clipped bary\n%.18e %.18e %.18e\n",*bary,bary[1],bary[2]);
  local_30 = 0;
  for (local_2c = 1; local_2c < 3; local_2c = local_2c + 1) {
    if (bary[local_30] <= bary[local_2c] && bary[local_2c] != bary[local_30]) {
      local_30 = local_2c;
    }
  }
  for (local_2c = 0; local_2c < 3; local_2c = local_2c + 1) {
    bary[local_2c] = 0.0;
  }
  bary[local_30] = 1.0;
  printf("modified bary\n%.18e %.18e %.18e\n",*bary,bary[1],bary[2]);
  return 4;
}

Assistant:

REF_FCN REF_STATUS ref_node_clip_bary3(REF_DBL *orig_bary, REF_DBL *bary) {
  REF_DBL total;

  bary[0] = MAX(0.0, orig_bary[0]);
  bary[1] = MAX(0.0, orig_bary[1]);
  bary[2] = MAX(0.0, orig_bary[2]);

  total = bary[0] + bary[1] + bary[2];

  if (ref_math_divisible(bary[0], total) &&
      ref_math_divisible(bary[1], total) &&
      ref_math_divisible(bary[2], total)) {
    bary[0] /= total;
    bary[1] /= total;
    bary[2] /= total;
  } else {
    REF_INT i, largest;
    printf("%s: %d: %s: div zero\ntot %.18e\nbary %.18e %.18e %.18e\n",
           __FILE__, __LINE__, __func__, total, orig_bary[0], orig_bary[1],
           orig_bary[2]);
    printf("clipped bary\n%.18e %.18e %.18e\n", bary[0], bary[1], bary[2]);
    /* chose one node */
    largest = 0;
    for (i = 1; i < 3; i++)
      if (bary[i] > bary[largest]) largest = i;
    for (i = 0; i < 3; i++) bary[i] = 0.0;
    bary[largest] = 1.0;
    printf("modified bary\n%.18e %.18e %.18e\n", bary[0], bary[1], bary[2]);
    return REF_DIV_ZERO;
  }

  RAS(bary[0] >= 0.0, "bary[0] not positive");
  RAS(bary[1] >= 0.0, "bary[1] not positive");
  RAS(bary[2] >= 0.0, "bary[2] not positive");

  return REF_SUCCESS;
}